

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_reader.c
# Opt level: O0

char * lafe_line_reader_next(lafe_line_reader *lr)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  int *piVar6;
  char *p;
  char *line_start;
  size_t new_buff_size;
  size_t bytes_read;
  size_t bytes_wanted;
  lafe_line_reader *lr_local;
  
  do {
    while (lr->line_end < lr->buff_end) {
      pcVar4 = lr->line_start;
      pcVar1 = lr->line_end;
      lr->line_end = pcVar1 + 1;
      lr->line_start = pcVar1 + 1;
      lafe_line_reader_find_eol(lr);
      if (lr->nullSeparator != 0) {
        return pcVar4;
      }
      if (*pcVar4 != '\0') {
        return pcVar4;
      }
    }
    if (lr->f == (FILE *)0x0) {
      if (lr->line_start == lr->buff_end) {
        lr_local = (lafe_line_reader *)0x0;
      }
      else {
        lr_local = (lafe_line_reader *)lr->line_start;
        lr->line_start = lr->buff_end;
      }
      return (char *)lr_local;
    }
    if (lr->buff < lr->line_start) {
      memmove(lr->buff,lr->line_start,(long)lr->buff_end - (long)lr->line_start);
      lr->buff_end = lr->buff_end + -((long)lr->line_start - (long)lr->buff);
      lr->line_end = lr->line_end + -((long)lr->line_start - (long)lr->buff);
      lr->line_start = lr->buff;
    }
    else {
      uVar3 = lr->buff_length * 2;
      if (uVar3 <= lr->buff_length) {
        lafe_errc(1,0xc,"Line too long in %s",lr->pathname);
      }
      lr->buff_length = uVar3;
      pcVar4 = (char *)realloc(lr->buff,uVar3 + 1);
      if (pcVar4 == (char *)0x0) {
        lafe_errc(1,0xc,"Line too long in %s",lr->pathname);
      }
      lr->buff_end = pcVar4 + ((long)lr->buff_end - (long)lr->buff);
      lr->line_end = pcVar4 + ((long)lr->line_end - (long)lr->buff);
      lr->buff = pcVar4;
      lr->line_start = pcVar4;
    }
    sVar5 = fread(lr->buff_end,1,(size_t)(lr->buff + (lr->buff_length - (long)lr->buff_end)),
                  (FILE *)lr->f);
    lr->buff_end = lr->buff_end + sVar5;
    *lr->buff_end = '\0';
    lafe_line_reader_find_eol(lr);
    iVar2 = ferror((FILE *)lr->f);
    if (iVar2 != 0) {
      piVar6 = __errno_location();
      lafe_errc(1,*piVar6,"Can\'t read %s",lr->pathname);
    }
    iVar2 = feof((FILE *)lr->f);
    if (iVar2 != 0) {
      if (lr->f != _stdin) {
        fclose((FILE *)lr->f);
      }
      lr->f = (FILE *)0x0;
    }
  } while( true );
}

Assistant:

const char *
lafe_line_reader_next(struct lafe_line_reader *lr)
{
	size_t bytes_wanted, bytes_read, new_buff_size;
	char *line_start, *p;

	for (;;) {
		/* If there's a line in the buffer, return it immediately. */
		while (lr->line_end < lr->buff_end) {
			line_start = lr->line_start;
			lr->line_start = ++lr->line_end;
			lafe_line_reader_find_eol(lr);

			if (lr->nullSeparator || line_start[0] != '\0')
				return (line_start);
		}

		/* If we're at end-of-file, process the final data. */
		if (lr->f == NULL) {
			if (lr->line_start == lr->buff_end)
				return (NULL); /* No more text */
			line_start = lr->line_start;
			lr->line_start = lr->buff_end;
			return (line_start);
		}

		/* Buffer only has part of a line. */
		if (lr->line_start > lr->buff) {
			/* Move a leftover fractional line to the beginning. */
			memmove(lr->buff, lr->line_start,
			    lr->buff_end - lr->line_start);
			lr->buff_end -= lr->line_start - lr->buff;
			lr->line_end -= lr->line_start - lr->buff;
			lr->line_start = lr->buff;
		} else {
			/* Line is too big; enlarge the buffer. */
			new_buff_size = lr->buff_length * 2;
			if (new_buff_size <= lr->buff_length)
				lafe_errc(1, ENOMEM,
				    "Line too long in %s", lr->pathname);
			lr->buff_length = new_buff_size;
			/*
			 * Allocate one extra byte to allow terminating
			 * the buffer.
			 */
			p = realloc(lr->buff, new_buff_size + 1);
			if (p == NULL)
				lafe_errc(1, ENOMEM,
				    "Line too long in %s", lr->pathname);
			lr->buff_end = p + (lr->buff_end - lr->buff);
			lr->line_end = p + (lr->line_end - lr->buff);
			lr->line_start = lr->buff = p;
		}

		/* Get some more data into the buffer. */
		bytes_wanted = lr->buff + lr->buff_length - lr->buff_end;
		bytes_read = fread(lr->buff_end, 1, bytes_wanted, lr->f);
		lr->buff_end += bytes_read;
		*lr->buff_end = '\0'; /* Always terminate buffer */
		lafe_line_reader_find_eol(lr);

		if (ferror(lr->f))
			lafe_errc(1, errno, "Can't read %s", lr->pathname);
		if (feof(lr->f)) {
			if (lr->f != stdin)
				fclose(lr->f);
			lr->f = NULL;
		}
	}
}